

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

string * __thiscall
glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::extend_string
          (string *__return_storage_ptr__,TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this,
          string *base_string,string *sub_string,size_t number_of_elements)

{
  undefined8 local_40;
  size_t sub_script_index;
  size_t number_of_elements_local;
  string *sub_string_local;
  string *base_string_local;
  TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this_local;
  string *temp_string;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)base_string);
  for (local_40 = 0; local_40 < number_of_elements; local_40 = local_40 + 1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)sub_string);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase<API>::extend_string(std::string base_string, std::string sub_string, size_t number_of_elements)
{
	std::string temp_string = base_string;

	for (size_t sub_script_index = 0; sub_script_index < number_of_elements; sub_script_index++)
	{
		temp_string += sub_string;
	}

	return temp_string;
}